

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_3_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_5c8;
  float c2s;
  float *input2;
  float *pfStack_5b8;
  float c1s;
  float *input1;
  float *pfStack_5a8;
  float c0s;
  float *input0;
  float *output;
  float *input0_end_local;
  float **inputs_local;
  float *vertical_coefficients_local;
  float *outputp_local;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  
  fVar1 = *vertical_coefficients;
  pfStack_5b8 = inputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_5c8 = inputs[2];
  fVar3 = vertical_coefficients[2];
  input0 = outputp;
  for (pfStack_5a8 = *inputs; 0x3f < (long)input0_end - (long)pfStack_5a8;
      pfStack_5a8 = pfStack_5a8 + 0x10) {
    local_268 = (float)*(undefined8 *)pfStack_5a8;
    fStack_264 = (float)((ulong)*(undefined8 *)pfStack_5a8 >> 0x20);
    fStack_260 = (float)*(undefined8 *)(pfStack_5a8 + 2);
    fStack_25c = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 2) >> 0x20);
    local_88 = (float)*(undefined8 *)input0;
    fStack_84 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_80 = (float)*(undefined8 *)(input0 + 2);
    fStack_7c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_288 = (float)*(undefined8 *)(pfStack_5a8 + 4);
    fStack_284 = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 4) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(pfStack_5a8 + 6);
    fStack_27c = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 6) >> 0x20);
    local_a8 = (float)*(undefined8 *)(input0 + 4);
    fStack_a4 = (float)((ulong)*(undefined8 *)(input0 + 4) >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(input0 + 6);
    fStack_9c = (float)((ulong)*(undefined8 *)(input0 + 6) >> 0x20);
    local_2a8 = (float)*(undefined8 *)(pfStack_5a8 + 8);
    fStack_2a4 = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 8) >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(pfStack_5a8 + 10);
    fStack_29c = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 10) >> 0x20);
    local_c8 = (float)*(undefined8 *)(input0 + 8);
    fStack_c4 = (float)((ulong)*(undefined8 *)(input0 + 8) >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(input0 + 10);
    fStack_bc = (float)((ulong)*(undefined8 *)(input0 + 10) >> 0x20);
    local_2c8 = (float)*(undefined8 *)(pfStack_5a8 + 0xc);
    fStack_2c4 = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 0xc) >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)(pfStack_5a8 + 0xe);
    fStack_2bc = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 0xe) >> 0x20);
    local_e8 = (float)*(undefined8 *)(input0 + 0xc);
    fStack_e4 = (float)((ulong)*(undefined8 *)(input0 + 0xc) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(input0 + 0xe);
    fStack_dc = (float)((ulong)*(undefined8 *)(input0 + 0xe) >> 0x20);
    local_2e8 = (float)*(undefined8 *)pfStack_5b8;
    fStack_2e4 = (float)((ulong)*(undefined8 *)pfStack_5b8 >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)(pfStack_5b8 + 2);
    fStack_2dc = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 2) >> 0x20);
    local_308 = (float)*(undefined8 *)(pfStack_5b8 + 4);
    fStack_304 = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 4) >> 0x20);
    fStack_300 = (float)*(undefined8 *)(pfStack_5b8 + 6);
    fStack_2fc = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 6) >> 0x20);
    local_328 = (float)*(undefined8 *)(pfStack_5b8 + 8);
    fStack_324 = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 8) >> 0x20);
    fStack_320 = (float)*(undefined8 *)(pfStack_5b8 + 10);
    fStack_31c = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 10) >> 0x20);
    local_348 = (float)*(undefined8 *)(pfStack_5b8 + 0xc);
    fStack_344 = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 0xc) >> 0x20);
    fStack_340 = (float)*(undefined8 *)(pfStack_5b8 + 0xe);
    fStack_33c = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 0xe) >> 0x20);
    local_368 = (float)*(undefined8 *)pfStack_5c8;
    fStack_364 = (float)((ulong)*(undefined8 *)pfStack_5c8 >> 0x20);
    fStack_360 = (float)*(undefined8 *)(pfStack_5c8 + 2);
    fStack_35c = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 2) >> 0x20);
    o1[3] = fStack_84 + fStack_264 * fVar1 + fStack_2e4 * fVar2 + fStack_364 * fVar3;
    o1[2] = local_88 + local_268 * fVar1 + local_2e8 * fVar2 + local_368 * fVar3;
    o0[1] = fStack_7c + fStack_25c * fVar1 + fStack_2dc * fVar2 + fStack_35c * fVar3;
    o0[0] = fStack_80 + fStack_260 * fVar1 + fStack_2e0 * fVar2 + fStack_360 * fVar3;
    local_388 = (float)*(undefined8 *)(pfStack_5c8 + 4);
    fStack_384 = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 4) >> 0x20);
    fStack_380 = (float)*(undefined8 *)(pfStack_5c8 + 6);
    fStack_37c = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 6) >> 0x20);
    o2[3] = fStack_a4 + fStack_284 * fVar1 + fStack_304 * fVar2 + fStack_384 * fVar3;
    o2[2] = local_a8 + local_288 * fVar1 + local_308 * fVar2 + local_388 * fVar3;
    o1[1] = fStack_9c + fStack_27c * fVar1 + fStack_2fc * fVar2 + fStack_37c * fVar3;
    o1[0] = fStack_a0 + fStack_280 * fVar1 + fStack_300 * fVar2 + fStack_380 * fVar3;
    local_3a8 = (float)*(undefined8 *)(pfStack_5c8 + 8);
    fStack_3a4 = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 8) >> 0x20);
    fStack_3a0 = (float)*(undefined8 *)(pfStack_5c8 + 10);
    fStack_39c = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 10) >> 0x20);
    o3[3] = fStack_c4 + fStack_2a4 * fVar1 + fStack_324 * fVar2 + fStack_3a4 * fVar3;
    o3[2] = local_c8 + local_2a8 * fVar1 + local_328 * fVar2 + local_3a8 * fVar3;
    o2[1] = fStack_bc + fStack_29c * fVar1 + fStack_31c * fVar2 + fStack_39c * fVar3;
    o2[0] = fStack_c0 + fStack_2a0 * fVar1 + fStack_320 * fVar2 + fStack_3a0 * fVar3;
    local_3c8 = (float)*(undefined8 *)(pfStack_5c8 + 0xc);
    fStack_3c4 = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 0xc) >> 0x20);
    fStack_3c0 = (float)*(undefined8 *)(pfStack_5c8 + 0xe);
    fStack_3bc = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 0xe) >> 0x20);
    r0[3] = fStack_e4 + fStack_2c4 * fVar1 + fStack_344 * fVar2 + fStack_3c4 * fVar3;
    r0[2] = local_e8 + local_2c8 * fVar1 + local_348 * fVar2 + local_3c8 * fVar3;
    o3[1] = fStack_dc + fStack_2bc * fVar1 + fStack_33c * fVar2 + fStack_3bc * fVar3;
    o3[0] = fStack_e0 + fStack_2c0 * fVar1 + fStack_340 * fVar2 + fStack_3c0 * fVar3;
    *(undefined8 *)input0 = o1._8_8_;
    *(undefined8 *)(input0 + 2) = o0._0_8_;
    *(undefined8 *)(input0 + 4) = o2._8_8_;
    *(undefined8 *)(input0 + 6) = o1._0_8_;
    *(undefined8 *)(input0 + 8) = o3._8_8_;
    *(undefined8 *)(input0 + 10) = o2._0_8_;
    *(undefined8 *)(input0 + 0xc) = r0._8_8_;
    *(undefined8 *)(input0 + 0xe) = o3._0_8_;
    input0 = input0 + 0x10;
    pfStack_5b8 = pfStack_5b8 + 0x10;
    pfStack_5c8 = pfStack_5c8 + 0x10;
  }
  for (; 0xf < (long)input0_end - (long)pfStack_5a8; pfStack_5a8 = pfStack_5a8 + 4) {
    local_3e8 = (float)*(undefined8 *)pfStack_5a8;
    fStack_3e4 = (float)((ulong)*(undefined8 *)pfStack_5a8 >> 0x20);
    fStack_3e0 = (float)*(undefined8 *)(pfStack_5a8 + 2);
    fStack_3dc = (float)((ulong)*(undefined8 *)(pfStack_5a8 + 2) >> 0x20);
    local_208 = (float)*(undefined8 *)input0;
    fStack_204 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_200 = (float)*(undefined8 *)(input0 + 2);
    fStack_1fc = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_408 = (float)*(undefined8 *)pfStack_5b8;
    fStack_404 = (float)((ulong)*(undefined8 *)pfStack_5b8 >> 0x20);
    fStack_400 = (float)*(undefined8 *)(pfStack_5b8 + 2);
    fStack_3fc = (float)((ulong)*(undefined8 *)(pfStack_5b8 + 2) >> 0x20);
    local_428 = (float)*(undefined8 *)pfStack_5c8;
    fStack_424 = (float)((ulong)*(undefined8 *)pfStack_5c8 >> 0x20);
    fStack_420 = (float)*(undefined8 *)(pfStack_5c8 + 2);
    fStack_41c = (float)((ulong)*(undefined8 *)(pfStack_5c8 + 2) >> 0x20);
    r0_1[3] = fStack_204 + fStack_3e4 * fVar1 + fStack_404 * fVar2 + fStack_424 * fVar3;
    r0_1[2] = local_208 + local_3e8 * fVar1 + local_408 * fVar2 + local_428 * fVar3;
    o0_1[1] = fStack_1fc + fStack_3dc * fVar1 + fStack_3fc * fVar2 + fStack_41c * fVar3;
    o0_1[0] = fStack_200 + fStack_3e0 * fVar1 + fStack_400 * fVar2 + fStack_420 * fVar3;
    *(undefined8 *)input0 = r0_1._8_8_;
    *(undefined8 *)(input0 + 2) = o0_1._0_8_;
    input0 = input0 + 4;
    pfStack_5b8 = pfStack_5b8 + 4;
    pfStack_5c8 = pfStack_5c8 + 4;
  }
  for (; pfStack_5a8 < input0_end; pfStack_5a8 = pfStack_5a8 + 1) {
    *input0 = *pfStack_5c8 * fVar3 + *pfStack_5b8 * fVar2 + *input0 + *pfStack_5a8 * fVar1;
    input0 = input0 + 1;
    pfStack_5b8 = pfStack_5b8 + 1;
    pfStack_5c8 = pfStack_5c8 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}